

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_split_tri(REF_SUBDIV ref_subdiv)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_INT *pRVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  REF_STATUS RVar6;
  undefined8 uVar7;
  void *unaff_RBP;
  REF_INT cell;
  int iVar8;
  long lVar9;
  ulong uVar10;
  REF_INT new_cell;
  REF_CELL tri_split;
  REF_INT edge20;
  REF_INT edge12;
  REF_CELL qua_split;
  REF_INT nodes [27];
  REF_INT new_nodes [27];
  REF_INT edge01;
  REF_INT local_134;
  REF_CELL local_130;
  int local_128;
  int local_124;
  REF_CELL local_120;
  REF_INT local_118;
  REF_INT local_114;
  REF_INT local_110;
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  REF_INT RStack_9c;
  REF_INT local_98;
  int local_3c;
  REF_CELL local_38;
  
  ref_cell = ref_subdiv->grid->cell[3];
  iVar8 = ref_cell->max;
  uVar10 = (ulong)iVar8;
  if ((long)uVar10 < 0) {
    bVar3 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x476,
           "ref_subdiv_split_tri","malloc marked_for_removal of REF_INT negative");
    uVar10 = 1;
  }
  else {
    unaff_RBP = malloc(uVar10 * 4);
    if (unaff_RBP == (void *)0x0) {
      bVar3 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x476,"ref_subdiv_split_tri","malloc marked_for_removal of REF_INT NULL");
      uVar10 = 2;
      unaff_RBP = (void *)0x0;
    }
    else {
      bVar3 = true;
      if (iVar8 != 0) {
        memset(unaff_RBP,0,uVar10 * 4);
      }
    }
  }
  uVar5 = (uint)uVar10;
  if (bVar3) {
    uVar4 = ref_cell_create(&local_130,ref_cell->type);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x478,"ref_subdiv_split_tri",(ulong)uVar4,"temp tri");
      uVar10 = (ulong)uVar4;
    }
    uVar5 = (uint)uVar10;
    if (uVar4 == 0) {
      local_38 = ref_subdiv->grid->cell[6];
      uVar4 = ref_cell_create(&local_120,local_38->type);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x47b,"ref_subdiv_split_tri",(ulong)uVar4,"temp qua");
        uVar10 = (ulong)uVar4;
      }
      uVar5 = (uint)uVar10;
      if (uVar4 == 0) {
        if (0 < ref_cell->max) {
          lVar9 = 0;
          do {
            iVar8 = (int)lVar9;
            if (ref_cell->c2n[(long)iVar8 * (long)ref_cell->size_per] != -1) {
              uVar5 = ref_cell_nodes(ref_cell,iVar8,&local_118);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x47e,"ref_subdiv_split_tri",(ulong)uVar5,"nodes");
                uVar10 = (ulong)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)uVar10;
              }
              uVar5 = ref_edge_with(ref_subdiv->edge,local_118,local_114,&local_3c);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x480,"ref_subdiv_split_tri",(ulong)uVar5,"e01");
                uVar10 = (ulong)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)uVar10;
              }
              uVar5 = ref_edge_with(ref_subdiv->edge,local_114,local_110,&local_124);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x482,"ref_subdiv_split_tri",(ulong)uVar5,"e12");
                uVar10 = (ulong)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)uVar10;
              }
              uVar5 = ref_edge_with(ref_subdiv->edge,local_110,local_118,&local_128);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x484,"ref_subdiv_split_tri",(ulong)uVar5,"e20");
                uVar10 = (ulong)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)uVar10;
              }
              pRVar2 = ref_subdiv->mark;
              iVar1 = pRVar2[local_3c];
              if (iVar1 == 0) {
LAB_0020a82e:
                if ((pRVar2[local_124] == 0) || ((iVar1 != 0 || (pRVar2[local_128] == 0)))) {
                  if ((pRVar2[local_124] == 0) && ((iVar1 != 0 && (pRVar2[local_128] != 0)))) {
                    *(undefined4 *)((long)unaff_RBP + lVar9 * 4) = 1;
                    uVar5 = ref_cell_nodes(ref_cell,iVar8,&local_a8);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x4f4,"ref_subdiv_split_tri",(ulong)uVar5,"nodes");
                      uVar10 = (ulong)uVar5;
                    }
                    if (uVar5 != 0) {
                      return (REF_STATUS)uVar10;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a4);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x4f7,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                      uVar10 = (ulong)uVar5;
                    }
                    if (uVar5 != 0) {
                      return (REF_STATUS)uVar10;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_118,local_110,&local_a0);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x4fa,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                      uVar10 = (ulong)uVar5;
                    }
                    if (uVar5 != 0) {
                      return (REF_STATUS)uVar10;
                    }
                    uVar5 = ref_cell_add(local_130,&local_a8,&local_134);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x4fb,"ref_subdiv_split_tri",(ulong)uVar5,"add");
                      uVar10 = (ulong)uVar5;
                    }
                    if (uVar5 != 0) {
                      return (REF_STATUS)uVar10;
                    }
                    uVar5 = ref_cell_nodes(ref_cell,iVar8,&local_a8);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x4fd,"ref_subdiv_split_tri",(ulong)uVar5,"nodes");
                      uVar10 = (ulong)uVar5;
                    }
                    if (uVar5 != 0) {
                      return (REF_STATUS)uVar10;
                    }
                    local_98 = RStack_9c;
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a8);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x501,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                      uVar10 = (ulong)uVar5;
                    }
                    if (uVar5 != 0) {
                      return (REF_STATUS)uVar10;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_118,local_110,&RStack_9c);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x504,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                      uVar10 = (ulong)uVar5;
                    }
                    if (uVar5 != 0) {
                      return (REF_STATUS)uVar10;
                    }
                    uVar5 = ref_cell_add(local_120,&local_a8,&local_134);
                    if (uVar5 != 0) {
                      uVar7 = 0x505;
                      goto LAB_0020b628;
                    }
                  }
                  else {
                    if (iVar1 != 0) {
                      *(undefined4 *)((long)unaff_RBP + lVar9 * 4) = 1;
                      uVar5 = ref_cell_nodes(ref_cell,iVar8,&local_a8);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x50b,"ref_subdiv_split_tri",(ulong)uVar5,"nodes");
                        uVar10 = (ulong)uVar5;
                      }
                      if (uVar5 != 0) {
                        return (REF_STATUS)uVar10;
                      }
                      uVar5 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a8);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x50e,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                        uVar10 = (ulong)uVar5;
                      }
                      if (uVar5 != 0) {
                        return (REF_STATUS)uVar10;
                      }
                      uVar5 = ref_cell_add(local_130,&local_a8,&local_134);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x50f,"ref_subdiv_split_tri",(ulong)uVar5,"add");
                        uVar10 = (ulong)uVar5;
                      }
                      if (uVar5 != 0) {
                        return (REF_STATUS)uVar10;
                      }
                      uVar5 = ref_cell_nodes(ref_cell,iVar8,&local_a8);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x510,"ref_subdiv_split_tri",(ulong)uVar5,"nodes");
                        uVar10 = (ulong)uVar5;
                      }
                      if (uVar5 != 0) {
                        return (REF_STATUS)uVar10;
                      }
                      uVar5 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a4);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x513,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                        uVar10 = (ulong)uVar5;
                      }
                      if (uVar5 != 0) {
                        return (REF_STATUS)uVar10;
                      }
                      uVar5 = ref_cell_add(local_130,&local_a8,&local_134);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x514,"ref_subdiv_split_tri",(ulong)uVar5,"add");
                        uVar10 = (ulong)uVar5;
                      }
                      if (uVar5 != 0) {
                        return (REF_STATUS)uVar10;
                      }
                    }
                    if (ref_subdiv->mark[local_124] != 0) {
                      *(undefined4 *)((long)unaff_RBP + lVar9 * 4) = 1;
                      uVar5 = ref_cell_nodes(ref_cell,iVar8,&local_a8);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x519,"ref_subdiv_split_tri",(ulong)uVar5,"nodes");
                        uVar10 = (ulong)uVar5;
                      }
                      if (uVar5 != 0) {
                        return (REF_STATUS)uVar10;
                      }
                      uVar5 = ref_subdiv_node_between(ref_subdiv,local_114,local_110,&local_a4);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x51c,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                        uVar10 = (ulong)uVar5;
                      }
                      if (uVar5 != 0) {
                        return (REF_STATUS)uVar10;
                      }
                      uVar5 = ref_cell_add(local_130,&local_a8,&local_134);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x51d,"ref_subdiv_split_tri",(ulong)uVar5,"add");
                        uVar10 = (ulong)uVar5;
                      }
                      if (uVar5 != 0) {
                        return (REF_STATUS)uVar10;
                      }
                      uVar5 = ref_cell_nodes(ref_cell,iVar8,&local_a8);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x51e,"ref_subdiv_split_tri",(ulong)uVar5,"nodes");
                        uVar10 = (ulong)uVar5;
                      }
                      if (uVar5 != 0) {
                        return (REF_STATUS)uVar10;
                      }
                      uVar5 = ref_subdiv_node_between(ref_subdiv,local_114,local_110,&local_a0);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x521,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                        uVar10 = (ulong)uVar5;
                      }
                      if (uVar5 != 0) {
                        return (REF_STATUS)uVar10;
                      }
                      uVar5 = ref_cell_add(local_130,&local_a8,&local_134);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                               ,0x522,"ref_subdiv_split_tri",(ulong)uVar5,"add");
                        uVar10 = (ulong)uVar5;
                      }
                      if (uVar5 != 0) {
                        return (REF_STATUS)uVar10;
                      }
                    }
                    if (ref_subdiv->mark[local_128] == 0) goto LAB_0020b64b;
                    *(undefined4 *)((long)unaff_RBP + lVar9 * 4) = 1;
                    uVar5 = ref_cell_nodes(ref_cell,iVar8,&local_a8);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x527,"ref_subdiv_split_tri",(ulong)uVar5,"nodes");
                      uVar10 = (ulong)uVar5;
                    }
                    if (uVar5 != 0) {
                      return (REF_STATUS)uVar10;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_110,local_118,&local_a0);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x52a,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                      uVar10 = (ulong)uVar5;
                    }
                    if (uVar5 != 0) {
                      return (REF_STATUS)uVar10;
                    }
                    uVar5 = ref_cell_add(local_130,&local_a8,&local_134);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x52b,"ref_subdiv_split_tri",(ulong)uVar5,"add");
                      uVar10 = (ulong)uVar5;
                    }
                    if (uVar5 != 0) {
                      return (REF_STATUS)uVar10;
                    }
                    uVar5 = ref_cell_nodes(ref_cell,iVar8,&local_a8);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x52c,"ref_subdiv_split_tri",(ulong)uVar5,"nodes");
                      uVar10 = (ulong)uVar5;
                    }
                    if (uVar5 != 0) {
                      return (REF_STATUS)uVar10;
                    }
                    uVar5 = ref_subdiv_node_between(ref_subdiv,local_110,local_118,&local_a8);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                             ,0x52f,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                      uVar10 = (ulong)uVar5;
                    }
                    if (uVar5 != 0) {
                      return (REF_STATUS)uVar10;
                    }
                    uVar5 = ref_cell_add(local_130,&local_a8,&local_134);
                    if (uVar5 != 0) {
                      uVar7 = 0x530;
                      goto LAB_0020b628;
                    }
                  }
                }
                else {
                  *(undefined4 *)((long)unaff_RBP + lVar9 * 4) = 1;
                  uVar5 = ref_cell_nodes(ref_cell,iVar8,&local_a8);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x4db,"ref_subdiv_split_tri",(ulong)uVar5,"nodes");
                    uVar10 = (ulong)uVar5;
                  }
                  if (uVar5 != 0) {
                    return (REF_STATUS)uVar10;
                  }
                  uVar5 = ref_subdiv_node_between(ref_subdiv,local_110,local_114,&local_a4);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x4de,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                    uVar10 = (ulong)uVar5;
                  }
                  if (uVar5 != 0) {
                    return (REF_STATUS)uVar10;
                  }
                  uVar5 = ref_subdiv_node_between(ref_subdiv,local_110,local_118,&local_a8);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x4e1,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                    uVar10 = (ulong)uVar5;
                  }
                  if (uVar5 != 0) {
                    return (REF_STATUS)uVar10;
                  }
                  uVar5 = ref_cell_add(local_130,&local_a8,&local_134);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x4e2,"ref_subdiv_split_tri",(ulong)uVar5,"add");
                    uVar10 = (ulong)uVar5;
                  }
                  if (uVar5 != 0) {
                    return (REF_STATUS)uVar10;
                  }
                  uVar5 = ref_cell_nodes(ref_cell,iVar8,&local_a8);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x4e4,"ref_subdiv_split_tri",(ulong)uVar5,"nodes");
                    uVar10 = (ulong)uVar5;
                  }
                  if (uVar5 != 0) {
                    return (REF_STATUS)uVar10;
                  }
                  local_98 = RStack_9c;
                  uVar5 = ref_subdiv_node_between(ref_subdiv,local_110,local_114,&local_a0);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x4e8,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                    uVar10 = (ulong)uVar5;
                  }
                  if (uVar5 != 0) {
                    return (REF_STATUS)uVar10;
                  }
                  uVar5 = ref_subdiv_node_between(ref_subdiv,local_110,local_118,&RStack_9c);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x4eb,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                    uVar10 = (ulong)uVar5;
                  }
                  if (uVar5 != 0) {
                    return (REF_STATUS)uVar10;
                  }
                  uVar5 = ref_cell_add(local_120,&local_a8,&local_134);
                  if (uVar5 != 0) {
                    uVar7 = 0x4ec;
LAB_0020b628:
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,uVar7,"ref_subdiv_split_tri",(ulong)uVar5,"add");
                    uVar10 = (ulong)uVar5;
                  }
                }
              }
              else if ((pRVar2[local_124] == 0) || (pRVar2[local_128] == 0)) {
                if ((iVar1 == 0) || ((pRVar2[local_124] == 0 || (pRVar2[local_128] != 0))))
                goto LAB_0020a82e;
                *(undefined4 *)((long)unaff_RBP + lVar9 * 4) = 1;
                uVar5 = ref_cell_nodes(ref_cell,iVar8,&local_a8);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4c1,"ref_subdiv_split_tri",(ulong)uVar5,"nodes");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_subdiv_node_between(ref_subdiv,local_114,local_110,&local_a0);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4c4,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_subdiv_node_between(ref_subdiv,local_114,local_118,&local_a8);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4c7,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_cell_add(local_130,&local_a8,&local_134);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4c8,"ref_subdiv_split_tri",(ulong)uVar5,"add");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_cell_nodes(ref_cell,iVar8,&local_a8);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4ca,"ref_subdiv_split_tri",(ulong)uVar5,"nodes");
                  uVar10 = (ulong)uVar5;
                }
                local_98 = RStack_9c;
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                RStack_9c = local_a0;
                uVar5 = ref_subdiv_node_between(ref_subdiv,local_114,local_110,&local_a0);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4cf,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_subdiv_node_between(ref_subdiv,local_114,local_118,&local_a4);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4d2,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_cell_add(local_120,&local_a8,&local_134);
                if (uVar5 != 0) {
                  uVar7 = 0x4d3;
                  goto LAB_0020b628;
                }
              }
              else {
                *(undefined4 *)((long)unaff_RBP + lVar9 * 4) = 1;
                uVar5 = ref_cell_nodes(ref_cell,iVar8,&local_a8);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x48b,"ref_subdiv_split_tri",(ulong)uVar5,"nodes");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a4);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x48e,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_subdiv_node_between(ref_subdiv,local_118,local_110,&local_a0);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x491,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_cell_add(local_130,&local_a8,&local_134);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x492,"ref_subdiv_split_tri",(ulong)uVar5,"add");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_cell_nodes(ref_cell,iVar8,&local_a8);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x495,"ref_subdiv_split_tri",(ulong)uVar5,"nodes");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_subdiv_node_between(ref_subdiv,local_114,local_118,&local_a8);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x498,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_subdiv_node_between(ref_subdiv,local_114,local_110,&local_a0);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x49b,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_cell_add(local_130,&local_a8,&local_134);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x49c,"ref_subdiv_split_tri",(ulong)uVar5,"add");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_cell_nodes(ref_cell,iVar8,&local_a8);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x49f,"ref_subdiv_split_tri",(ulong)uVar5,"nodes");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_subdiv_node_between(ref_subdiv,local_110,local_114,&local_a4);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4a2,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_subdiv_node_between(ref_subdiv,local_110,local_118,&local_a8);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4a5,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_cell_add(local_130,&local_a8,&local_134);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4a6,"ref_subdiv_split_tri",(ulong)uVar5,"add");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_cell_nodes(ref_cell,iVar8,&local_a8);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4a9,"ref_subdiv_split_tri",(ulong)uVar5,"nodes");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a8);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4ac,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_subdiv_node_between(ref_subdiv,local_114,local_110,&local_a4);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4af,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_subdiv_node_between(ref_subdiv,local_110,local_118,&local_a0);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x4b2,"ref_subdiv_split_tri",(ulong)uVar5,"mis");
                  uVar10 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar10;
                }
                uVar5 = ref_cell_add(local_130,&local_a8,&local_134);
                if (uVar5 != 0) {
                  uVar7 = 0x4b3;
                  goto LAB_0020b628;
                }
              }
              if (uVar5 != 0) {
                return (REF_STATUS)uVar10;
              }
            }
LAB_0020b64b:
            lVar9 = lVar9 + 1;
          } while (lVar9 < ref_cell->max);
        }
        if (0 < ref_cell->max) {
          lVar9 = 0;
          do {
            if (*(int *)((long)unaff_RBP + lVar9 * 4) == 1) {
              uVar5 = ref_cell_remove(ref_cell,(REF_INT)lVar9);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x536,"ref_subdiv_split_tri",(ulong)uVar5,"remove");
                uVar10 = (ulong)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)uVar10;
              }
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 < ref_cell->max);
        }
        if (0 < local_130->max) {
          cell = 0;
          do {
            RVar6 = ref_cell_nodes(local_130,cell,&local_118);
            if (RVar6 == 0) {
              uVar5 = ref_subdiv_add_local_cell(ref_subdiv,ref_cell,&local_118);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x539,"ref_subdiv_split_tri",(ulong)uVar5,"add local");
                uVar10 = (ulong)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)uVar10;
              }
            }
            cell = cell + 1;
          } while (cell < local_130->max);
        }
        if (0 < local_120->max) {
          iVar8 = 0;
          do {
            RVar6 = ref_cell_nodes(local_120,iVar8,&local_118);
            if (RVar6 == 0) {
              uVar5 = ref_subdiv_add_local_cell(ref_subdiv,local_38,&local_118);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x53c,"ref_subdiv_split_tri",(ulong)uVar5,"add local");
                uVar10 = (ulong)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)uVar10;
              }
            }
            iVar8 = iVar8 + 1;
          } while (iVar8 < local_120->max);
        }
        uVar5 = ref_cell_free(local_130);
        if (uVar5 == 0) {
          uVar5 = ref_cell_free(local_120);
          if (uVar5 == 0) {
            free(unaff_RBP);
            uVar5 = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x53f,"ref_subdiv_split_tri",(ulong)uVar5,"temp qua free");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x53e,"ref_subdiv_split_tri",(ulong)uVar5,"temp tri free");
        }
      }
    }
  }
  return uVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_split_tri(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_CELL tri, qua;
  REF_CELL tri_split, qua_split;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT *marked_for_removal;

  REF_INT edge01, edge12, edge20;

  tri = ref_grid_tri(ref_subdiv_grid(ref_subdiv));

  ref_malloc_init(marked_for_removal, ref_cell_max(tri), REF_INT, 0);

  RSS(ref_cell_create(&tri_split, ref_cell_type(tri)), "temp tri");

  qua = ref_grid_qua(ref_subdiv_grid(ref_subdiv));
  RSS(ref_cell_create(&qua_split, ref_cell_type(qua)), "temp qua");

  each_ref_cell_valid_cell(tri, cell) {
    RSS(ref_cell_nodes(tri, cell, nodes), "nodes");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[0], nodes[1], &edge01),
        "e01");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[1], nodes[2], &edge12),
        "e12");
    RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), nodes[2], nodes[0], &edge20),
        "e20");

    if (ref_subdiv_mark(ref_subdiv, edge01) &&
        ref_subdiv_mark(ref_subdiv, edge12) &&
        ref_subdiv_mark(ref_subdiv, edge20)) {
      marked_for_removal[cell] = 1;
      /* near node 0 */
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");

      /* near node 1 */
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[0],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");

      /* near node 2 */
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");

      /* center */
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
      continue;
    }

    /*
      2   3-2
      |\  | |
      0-1 0-1
     */

    if (ref_subdiv_mark(ref_subdiv, edge01) &&
        ref_subdiv_mark(ref_subdiv, edge12) &&
        !ref_subdiv_mark(ref_subdiv, edge20)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[0],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");

      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      new_nodes[4] = new_nodes[3]; /* faceid */
      new_nodes[3] = new_nodes[2]; /* last node */
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[0],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_cell_add(qua_split, new_nodes, &new_cell), "add");
      continue;
    }

    if (ref_subdiv_mark(ref_subdiv, edge12) &&
        ref_subdiv_mark(ref_subdiv, edge20) &&
        !ref_subdiv_mark(ref_subdiv, edge01)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");

      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      new_nodes[4] = new_nodes[3]; /* faceid */
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[1],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                  &(new_nodes[3])),
          "mis");
      RSS(ref_cell_add(qua_split, new_nodes, &new_cell), "add");
      continue;
    }

    if (ref_subdiv_mark(ref_subdiv, edge20) &&
        ref_subdiv_mark(ref_subdiv, edge01) &&
        !ref_subdiv_mark(ref_subdiv, edge12)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");

      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      new_nodes[4] = new_nodes[3]; /* faceid */
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                  &(new_nodes[3])),
          "mis");
      RSS(ref_cell_add(qua_split, new_nodes, &new_cell), "add");
      continue;
    }

    if (ref_subdiv_mark(ref_subdiv, edge01)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
    }

    if (ref_subdiv_mark(ref_subdiv, edge12)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[1])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
    }

    if (ref_subdiv_mark(ref_subdiv, edge20)) {
      marked_for_removal[cell] = 1;
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                  &(new_nodes[2])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
      RSS(ref_cell_nodes(tri, cell, new_nodes), "nodes");
      RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                  &(new_nodes[0])),
          "mis");
      RSS(ref_cell_add(tri_split, new_nodes, &new_cell), "add");
    }
  }

  for (cell = 0; cell < ref_cell_max(tri); cell++)
    if (1 == marked_for_removal[cell])
      RSS(ref_cell_remove(tri, cell), "remove");

  each_ref_cell_valid_cell_with_nodes(tri_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, tri, nodes), "add local");

  each_ref_cell_valid_cell_with_nodes(qua_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, qua, nodes), "add local");

  RSS(ref_cell_free(tri_split), "temp tri free");
  RSS(ref_cell_free(qua_split), "temp qua free");

  free(marked_for_removal);

  return REF_SUCCESS;
}